

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O2

void __thiscall SDLInputJoystickManager::~SDLInputJoystickManager(SDLInputJoystickManager *this)

{
  SDLInputJoystick *pSVar1;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < (this->Joysticks).Count; uVar2 = uVar2 + 1) {
    pSVar1 = (this->Joysticks).Array[uVar2];
    if (pSVar1 != (SDLInputJoystick *)0x0) {
      (*(pSVar1->super_IJoystickConfig)._vptr_IJoystickConfig[1])();
    }
  }
  TArray<SDLInputJoystick_*,_SDLInputJoystick_*>::~TArray(&this->Joysticks);
  return;
}

Assistant:

~SDLInputJoystickManager()
	{
		for(unsigned int i = 0;i < Joysticks.Size();i++)
			delete Joysticks[i];
	}